

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_servername_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  ulong uVar1;
  int iVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar message;
  ulong uVar5;
  
  uVar5 = (ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8);
  if (uVar5 + 2 == len) {
    iVar2 = 0;
    if (uVar5 != 0) {
      puVar3 = buf + 2;
      do {
        uVar4 = (ulong)(ushort)(*(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8);
        uVar1 = uVar4 + 3;
        if (uVar5 < uVar1) goto LAB_0011b94d;
        if (*puVar3 == '\0') {
          iVar2 = (*ssl->conf->f_sni)(ssl->conf->p_sni,ssl,puVar3 + 3,uVar4);
          if (iVar2 == 0) {
            return 0;
          }
          message = 'p';
          goto LAB_0011b95a;
        }
        puVar3 = puVar3 + uVar1;
        uVar5 = uVar5 - uVar1;
        iVar2 = 0;
      } while (uVar5 != 0);
    }
  }
  else {
LAB_0011b94d:
    message = '2';
LAB_0011b95a:
    mbedtls_ssl_send_alert_message(ssl,'\x02',message);
    iVar2 = -0x7900;
  }
  return iVar2;
}

Assistant:

static int ssl_parse_servername_ext( mbedtls_ssl_context *ssl,
                                     const unsigned char *buf,
                                     size_t len )
{
    int ret;
    size_t servername_list_size, hostname_len;
    const unsigned char *p;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "parse ServerName extension" ) );

    servername_list_size = ( ( buf[0] << 8 ) | ( buf[1] ) );
    if( servername_list_size + 2 != len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    p = buf + 2;
    while( servername_list_size > 0 )
    {
        hostname_len = ( ( p[1] << 8 ) | p[2] );
        if( hostname_len + 3 > servername_list_size )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
            return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
        }

        if( p[0] == MBEDTLS_TLS_EXT_SERVERNAME_HOSTNAME )
        {
            ret = ssl->conf->f_sni( ssl->conf->p_sni,
                                    ssl, p + 3, hostname_len );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_sni_wrapper", ret );
                mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                        MBEDTLS_SSL_ALERT_MSG_UNRECOGNIZED_NAME );
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
            }
            return( 0 );
        }

        servername_list_size -= hostname_len + 3;
        p += hostname_len + 3;
    }

    if( servername_list_size != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    return( 0 );
}